

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.cc
# Opt level: O1

void __thiscall libsgp4::Tle::ExtractDouble(Tle *this,string *str,int point_pos,double *val)

{
  bool bVar1;
  char *pcVar2;
  runtime_error *prVar3;
  char *pcVar4;
  char cVar5;
  string temp;
  string local_58;
  double *local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38 = val;
  if (str->_M_string_length != 0) {
    pcVar2 = (str->_M_dataplus)._M_p;
    bVar1 = false;
    pcVar4 = pcVar2;
    do {
      cVar5 = (char)&local_58;
      if (point_pos < 0) {
LAB_0010a28c:
        if (pcVar4 == pcVar2 && point_pos == -1) {
          std::__cxx11::string::push_back(cVar5);
          std::__cxx11::string::push_back(cVar5);
        }
        if (9 < (int)*pcVar4 - 0x30U) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Invalid digit");
LAB_0010a3b0:
          *(undefined ***)prVar3 = &PTR__runtime_error_0010ed90;
          __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
        }
LAB_0010a2c7:
        std::__cxx11::string::push_back(cVar5);
      }
      else {
        if (pcVar2 + ((ulong)(uint)point_pos - 1) <= pcVar4) {
          if (pcVar4 != pcVar2 + ((ulong)(uint)point_pos - 1) || point_pos < 0) goto LAB_0010a28c;
          if (local_58._M_string_length == 0) {
            std::__cxx11::string::push_back(cVar5);
          }
          if (*pcVar4 != '.') {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Failed to find decimal point");
            goto LAB_0010a3b0;
          }
          goto LAB_0010a2c7;
        }
        if ((pcVar4 == pcVar2) && ((*pcVar4 == '-' || (*pcVar4 == '+')))) {
          std::__cxx11::string::push_back(cVar5);
        }
        else if ((int)*pcVar4 - 0x30U < 10) {
          bVar1 = true;
          std::__cxx11::string::push_back(cVar5);
        }
        else {
          if (bVar1) {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Unexpected non digit");
LAB_0010a3ec:
            *(undefined ***)prVar3 = &PTR__runtime_error_0010ed90;
            __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
          }
          if (*pcVar4 != ' ') {
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,"Invalid character");
            goto LAB_0010a3ec;
          }
        }
      }
      pcVar4 = pcVar4 + 1;
      pcVar2 = (str->_M_dataplus)._M_p;
    } while (pcVar4 != pcVar2 + str->_M_string_length);
  }
  bVar1 = Util::FromString<double>(&local_58,local_38);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"Failed to convert value to double");
    *(undefined ***)prVar3 = &PTR__runtime_error_0010ed90;
    __cxa_throw(prVar3,&TleException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Tle::ExtractDouble(const std::string& str, int point_pos, double& val)
{
    std::string temp;
    bool found_digit = false;

    for (std::string::const_iterator i = str.begin(); i != str.end(); ++i)
    {
        /*
         * integer part
         */
        if (point_pos >= 0 && i < str.begin() + point_pos - 1)
        {
            bool done = false;

            if (i == str.begin())
            {
                if(*i == '-' || *i == '+')
                {
                    /*
                     * first character could be signed
                     */
                    temp += *i;
                    done = true;
                }
            }

            if (!done)
            {
                if (isdigit(*i))
                {
                    found_digit = true;
                    temp += *i;
                }
                else if (found_digit)
                {
                    throw TleException("Unexpected non digit");
                }
                else if (*i != ' ')
                {
                    throw TleException("Invalid character");
                }
            }
        }
        /*
         * decimal point
         */
        else if (point_pos >= 0 && i == str.begin() + point_pos - 1)
        {
            if (temp.length() == 0)
            {
                /*
                 * integer part is blank, so add a '0'
                 */
                temp += '0';
            }

            if (*i == '.')
            {
                /*
                 * decimal point found
                 */
                temp += *i;
            }
            else
            {
                throw TleException("Failed to find decimal point");
            }
        }
        /*
         * fraction part
         */
        else
        {
            if (i == str.begin() && point_pos == -1)
            {
                /*
                 * no decimal point expected, add 0. beginning
                 */
                temp += '0';
                temp += '.';
            }
            
            /*
             * should be a digit
             */
            if (isdigit(*i))
            {
                temp += *i;
            }
            else
            {
                throw TleException("Invalid digit");
            }
        }
    }

    if (!Util::FromString<double>(temp, val))
    {
        throw TleException("Failed to convert value to double");
    }
}